

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excerpt_appender.cpp
# Opt level: O1

void __thiscall
cornelich::excerpt_appender::start_excerpt(excerpt_appender *this,int32_t capacity,int32_t cycle)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  undefined1 auVar3 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int32_t thread_id;
  int32_t iVar5;
  int iVar6;
  undefined1 local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  thread_id = util::get_native_thread_id();
  if ((ulong)(long)thread_id >> ((byte)(this->m_chronicle->m_settings).m_thread_id_bits & 0x3f) != 0
     ) {
    __assert_fail("(thread_id & m_chronicle.m_settings.thread_id_mask()) == thread_id",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich/excerpt_appender.cpp"
                  ,0x34,
                  "void cornelich::excerpt_appender::start_excerpt(std::int32_t, std::int32_t)");
  }
  if (this->m_last_cycle == cycle) {
    if (thread_id == this->m_last_thread_id) goto LAB_0011e223;
    p_Var1 = (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
  }
  else {
    p_Var1 = (this->m_index_region).
             super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->m_index_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    (this->m_index_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    p_Var1 = (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    this->m_last_cycle = cycle;
    iVar5 = vanilla_index::last_index_file_number(&this->m_chronicle->m_index,cycle,0);
    this->m_last_index_file_number = iVar5;
  }
  this->m_last_thread_id = thread_id;
LAB_0011e223:
  if ((this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    iVar5 = vanilla_data::find_next_data_file_number(&this->m_chronicle->m_data,cycle,thread_id);
    this->m_last_data_file_number = iVar5;
    vanilla_data::data_for
              ((vanilla_data *)local_48,(int)this->m_chronicle + 0x110,cycle,thread_id,
               SUB41(iVar5,0));
    p_Var4 = p_Stack_40;
    auVar3 = local_48;
    local_48 = (undefined1  [8])0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)auVar3;
    (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var4;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
  }
  peVar2 = (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar2->m_limit_offset - (peVar2->m_position_offset).super___atomic_base<int>._M_i <
      capacity + 4) {
    iVar6 = this->m_last_data_file_number + 1;
    this->m_last_data_file_number = iVar6;
    vanilla_data::data_for
              ((vanilla_data *)local_48,(int)this->m_chronicle + 0x110,cycle,thread_id,
               SUB41(iVar6,0));
    p_Var4 = p_Stack_40;
    auVar3 = local_48;
    local_48 = (undefined1  [8])0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)auVar3;
    (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var4;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
  }
  peVar2 = (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (this->m_buffer).m_data =
       (uint8_t *)
       ((long)(peVar2->m_region).m_base +
       ((long)(peVar2->m_position_offset).super___atomic_base<int>._M_i -
       (long)peVar2->m_start_offset) + 4);
  (this->m_buffer).m_position = 0;
  (this->m_buffer).m_limit = capacity;
  this->m_finished = false;
  return;
}

Assistant:

void excerpt_appender::start_excerpt(std::int32_t capacity, std::int32_t cycle)
{
    auto thread_id = util::get_native_thread_id();
    assert((thread_id & m_chronicle.m_settings.thread_id_mask()) == thread_id);

    if (cycle != m_last_cycle)
    {
        m_index_region.reset();

        m_data_region.reset();

        m_last_cycle = cycle;
        m_last_index_file_number = m_chronicle.m_index.last_index_file_number(m_last_cycle, 0);
        m_last_thread_id = thread_id;
    }
    else if (thread_id != m_last_thread_id)
    {
        m_data_region.reset();
        m_last_thread_id = thread_id;
    }

    if (!m_data_region)
    {
        m_last_data_file_number = m_chronicle.m_data.find_next_data_file_number(cycle, thread_id);
        m_data_region = m_chronicle.m_data.data_for(cycle,thread_id, m_last_data_file_number, true);
    }

    if (m_data_region->remaining() < static_cast<std::int32_t>(capacity) + 4) // +4 to store the size later on (see finish())
    {
        m_data_region = m_chronicle.m_data.data_for(cycle, thread_id, ++m_last_data_file_number, true);
    }

    m_buffer.reset(m_data_region->data() + m_data_region->position() + 4, 0, static_cast<std::int32_t>(capacity));
    __builtin_prefetch(m_data_region->data() + 64, 1);
    m_finished = false;
}